

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O0

void __thiscall
tf::
Pipeline<tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/text_pipeline.cpp:76:36)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/text_pipeline.cpp:87:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/text_pipeline.cpp:97:36)>_>
::_on_pipe(Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:76:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:87:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:97:36)>_>
           *this,Pipeflow *pf,Runtime *rt)

{
  anon_class_16_2_f9f079a5 func;
  size_t in_RDX;
  tuple<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:76:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:87:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:97:36)>_>
  *in_RSI;
  Pipeflow *in_RDI;
  Runtime *unaff_retaddr;
  
  func.rt = unaff_retaddr;
  func.pf = in_RDI;
  visit_tuple<tf::Pipeline<tf::Pipe<main::__1>,tf::Pipe<main::__2>,tf::Pipe<main::__0>>::_on_pipe(tf::Pipeflow&,tf::Runtime&)::_lambda(auto:1&&)_1_,std::tuple<tf::Pipe<main::__1>,tf::Pipe<main::__2>,tf::Pipe<main::__0>>,0ul>
            (func,in_RSI,in_RDX);
  return;
}

Assistant:

void Pipeline<Ps...>::_on_pipe(Pipeflow& pf, Runtime& rt) {
  visit_tuple([&](auto&& pipe){
    using callable_t = typename std::decay_t<decltype(pipe)>::callable_t;
    if constexpr (std::is_invocable_v<callable_t, Pipeflow&>) {
      pipe._callable(pf);
    }
    else if constexpr(std::is_invocable_v<callable_t, Pipeflow&, Runtime&>) {
      pipe._callable(pf, rt);
    }
    else {
      static_assert(dependent_false_v<callable_t>, "un-supported pipe callable type");
    }
  }, _pipes, pf._pipe);
}